

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::Option::run_callback(Option *this)

{
  bool bVar1;
  ConversionError *this_00;
  results_t *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_40;
  undefined1 local_19;
  results_t *prStack_18;
  bool local_result;
  results_t *send_results;
  Option *this_local;
  
  send_results = (results_t *)this;
  if (this->current_option_state_ == parsing) {
    _validate_results(this,&this->results_);
    this->current_option_state_ = validated;
  }
  if ((int)this->current_option_state_ < 4) {
    _reduce_results(this,&this->proc_results_,&this->results_);
    this->current_option_state_ = reduced;
  }
  if (3 < (int)this->current_option_state_) {
    this->current_option_state_ = callback_run;
    bVar1 = ::std::function::operator_cast_to_bool((function *)&this->callback_);
    if (bVar1) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->proc_results_);
      if (bVar1) {
        local_80 = &this->results_;
      }
      else {
        local_80 = &this->proc_results_;
      }
      prStack_18 = local_80;
      local_19 = std::
                 function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                 ::operator()(&this->callback_,local_80);
      if (!(bool)local_19) {
        this_00 = (ConversionError *)__cxa_allocate_exception(0x38);
        get_name_abi_cxx11_(&local_40,this,false,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_68,&this->results_);
        ConversionError::ConversionError(this_00,&local_40,&local_68);
        __cxa_throw(this_00,&ConversionError::typeinfo,ConversionError::~ConversionError);
      }
    }
  }
  return;
}

Assistant:

void run_callback() {

        if(current_option_state_ == option_state::parsing) {
            _validate_results(results_);
            current_option_state_ = option_state::validated;
        }

        if(current_option_state_ < option_state::reduced) {
            _reduce_results(proc_results_, results_);
            current_option_state_ = option_state::reduced;
        }
        if(current_option_state_ >= option_state::reduced) {
            current_option_state_ = option_state::callback_run;
            if(!(callback_)) {
                return;
            }
            const results_t &send_results = proc_results_.empty() ? results_ : proc_results_;
            bool local_result = callback_(send_results);

            if(!local_result)
                throw ConversionError(get_name(), results_);
        }
    }